

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  byte bVar1;
  u8 uVar2;
  Fts3Phrase *pFVar3;
  sqlite3_vtab *psVar4;
  Fts3Phrase *pFVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 *puVar8;
  bool bVar9;
  uint uVar10;
  Fts3Expr *pFVar11;
  ulong uVar12;
  u8 uVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  long in_FS_OFFSET;
  char cVar17;
  int rc;
  undefined1 *local_60;
  int local_54;
  char *local_50;
  undefined1 *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = pExpr->pPhrase;
  psVar4 = (pCsr->base).pVtab;
  *ppOut = (char *)0x0;
  if ((pFVar3->iColumn == iCol) || (*(int *)&psVar4[2].pModule <= pFVar3->iColumn)) {
    local_54 = -0x55555556;
    local_60 = (undefined1 *)pExpr->iDocid;
    local_50 = (pFVar3->doclist).pList;
    if ((local_60 == (undefined1 *)pCsr->iPrevId) && (pExpr->bEof == '\0')) {
LAB_001bbc37:
      iVar15 = 0;
      if (local_50 != (char *)0x0) {
        if (*local_50 == '\x01') {
          pcVar16 = local_50 + 1;
          if (local_50[1] < '\0') {
            local_50 = pcVar16;
            uVar10 = sqlite3Fts3GetVarint32(pcVar16,&local_54);
            uVar12 = (ulong)uVar10;
          }
          else {
            uVar12 = 1;
            local_54 = (int)local_50[1];
          }
          local_50 = pcVar16 + uVar12;
        }
        else {
          local_54 = 0;
        }
        while (local_54 < iCol) {
          fts3ColumnlistCopy((char **)0x0,&local_50);
          iVar15 = 0;
          if (*local_50 == '\0') goto LAB_001bba0d;
          pcVar16 = local_50 + 1;
          uVar12 = 1;
          iVar15 = (int)local_50[1];
          if (local_50[1] < '\0') {
            uVar10 = sqlite3Fts3GetVarint32(pcVar16,&local_54);
            uVar12 = (ulong)uVar10;
            iVar15 = local_54;
          }
          local_54 = iVar15;
          local_50 = pcVar16 + uVar12;
        }
        pcVar16 = local_50;
        if (*local_50 == '\0') {
          pcVar16 = (char *)0x0;
        }
        if (local_54 != iCol) {
          pcVar16 = (char *)0x0;
        }
        *ppOut = pcVar16;
        iVar15 = 0;
      }
    }
    else {
      rc = 0;
      bVar1 = *(byte *)((long)&psVar4[0x13].pModule + 7);
      bVar7 = false;
      bVar9 = false;
      pFVar11 = pExpr;
      while (pFVar11 = pFVar11->pParent, pFVar11 != (Fts3Expr *)0x0) {
        if (pFVar11->eType == 4) {
          bVar7 = true;
        }
        if (pFVar11->eType == 1) {
          pExpr = pFVar11;
        }
        if (pFVar11->bEof != '\0') {
          bVar9 = true;
        }
      }
      pFVar11 = pExpr;
      if (bVar7) {
        for (; pFVar11->bDeferred != '\0'; pFVar11 = pFVar11->pParent) {
        }
        if (pFVar3->bIncr != 0) {
          uVar2 = pFVar11->bEof;
          fts3EvalRestart(pCsr,pFVar11,&rc);
          do {
            iVar15 = rc;
            if (rc != 0) goto LAB_001bba0d;
            uVar13 = pFVar11->bEof;
            if (uVar13 != '\0') goto LAB_001bb9d4;
            fts3EvalNextRow(pCsr,pFVar11,&rc);
          } while ((uVar2 != '\0') || ((undefined1 *)pFVar11->iDocid != local_60));
          iVar15 = rc;
          if (rc != 0) goto LAB_001bba0d;
          uVar13 = pFVar11->bEof;
LAB_001bb9d4:
          iVar15 = 0x10b;
          if (uVar13 != uVar2) goto LAB_001bba0d;
        }
        if (!bVar9) {
LAB_001bba35:
          bVar7 = true;
LAB_001bba41:
          if (pExpr != (Fts3Expr *)0x0) {
            pFVar11 = pExpr;
            if (pExpr->eType == 1) {
              pFVar11 = pExpr->pRight;
            }
            pFVar5 = pFVar11->pPhrase;
            pcVar16 = pFVar5->pOrPoslist;
            local_60 = (undefined1 *)pFVar5->iOrDocid;
            iVar15 = (pFVar5->doclist).nAll;
            local_50 = pcVar16;
            if (pCsr->bDesc != bVar1) {
              if (iVar15 == 0) {
                bVar9 = true;
              }
              else if (pcVar16 == (char *)0x0) {
                bVar9 = false;
              }
              else {
                bVar9 = pcVar16 <= (pFVar5->doclist).aAll;
              }
              local_48 = (undefined1 *)CONCAT71(local_48._1_7_,bVar9);
              do {
                cVar17 = (char)local_48;
                if (local_50 == (char *)0x0) {
                  if ((char)local_48 != '\0') {
                    pcVar16 = (char *)0x0;
                    goto LAB_001bbbf6;
                  }
                }
                else {
                  bVar9 = (long)local_60 < pCsr->iPrevId;
                  if (bVar1 == 0) {
                    bVar9 = pCsr->iPrevId < (long)local_60;
                  }
                  pcVar16 = local_50;
                  if ((!bVar9) || ((char)local_48 != '\0')) goto LAB_001bbbf6;
                }
                sqlite3Fts3DoclistPrev
                          ((uint)bVar1,(pFVar5->doclist).aAll,(pFVar5->doclist).nAll,&local_50,
                           (sqlite3_int64 *)&local_60,(int *)&local_40,(u8 *)&local_48);
              } while( true );
            }
            if (iVar15 == 0) {
              cVar17 = true;
            }
            else {
              cVar17 = (pFVar5->doclist).aAll + iVar15 <= pcVar16;
            }
            do {
              while (puVar8 = local_60, pcVar16 == (char *)0x0) {
                if ((bool)cVar17 != false) goto LAB_001bbbf6;
                pcVar16 = (pFVar5->doclist).aAll;
                iVar15 = sqlite3Fts3GetVarintU(pcVar16,(sqlite_uint64 *)&local_60);
                pcVar16 = pcVar16 + iVar15;
LAB_001bbb72:
                cVar17 = false;
              }
              iVar15 = -(uint)(local_60 != (undefined1 *)pCsr->iPrevId);
              if ((long)pCsr->iPrevId < (long)local_60) {
                iVar15 = 1;
              }
              iVar14 = -iVar15;
              if (bVar1 == 0) {
                iVar14 = iVar15;
              }
              if ((-1 < iVar14) || ((bool)cVar17 != false)) goto LAB_001bbbf6;
              iVar15 = (pFVar5->doclist).nAll;
              pcVar6 = (pFVar5->doclist).aAll;
              local_40 = pcVar16;
              fts3PoslistCopy((char **)0x0,&local_40);
              for (pcVar16 = local_40; pcVar16 < pcVar6 + iVar15; pcVar16 = pcVar16 + 1) {
                if (*pcVar16 != '\0') {
                  local_48 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar15 = sqlite3Fts3GetVarintU(pcVar16,(sqlite_uint64 *)&local_48);
                  pcVar16 = pcVar16 + iVar15;
                  local_60 = (undefined1 *)-(long)local_48;
                  if (bVar1 == 0) {
                    local_60 = local_48;
                  }
                  local_60 = puVar8 + (long)local_60;
                  goto LAB_001bbb72;
                }
              }
              cVar17 = true;
            } while( true );
          }
          if (bVar7) {
            local_50 = pFVar3->pOrPoslist;
          }
          else {
            local_50 = (char *)0x0;
          }
          goto LAB_001bbc37;
        }
        do {
          if (pFVar11->bEof != '\0') goto LAB_001bba35;
          fts3EvalNextRow(pCsr,pFVar11,&rc);
          iVar15 = rc;
        } while (rc == 0);
      }
      else {
        iVar15 = 0;
      }
    }
  }
  else {
    iVar15 = 0;
  }
LAB_001bba0d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar15;
LAB_001bbbf6:
  pFVar5->pOrPoslist = pcVar16;
  pFVar5->iOrDocid = (i64)local_60;
  if ((cVar17 != '\0') || (local_60 != (undefined1 *)pCsr->iPrevId)) {
    bVar7 = false;
  }
  pExpr = pExpr->pLeft;
  goto LAB_001bba41;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    Fts3Expr *pRun;               /* Closest non-deferred ancestor of pNear */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not,
    ** return NULL. Otherwise, the entry that corresponds to docid
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;
    pRun = pNear;
    while( pRun->bDeferred ){
      assert( pRun->pParent );
      pRun = pRun->pParent;
    }

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pRun->bEof;
      fts3EvalRestart(pCsr, pRun, &rc);
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
        if( bEofSave==0 && pRun->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
      if( rc==SQLITE_OK && pRun->bEof!=bEofSave ){
        rc = FTS_CORRUPT_VTAB;
      }
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}